

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O3

void WI_Drawer(void)

{
  double dVar1;
  player_t *player;
  DBot *pDVar2;
  FFont *pFVar3;
  DFrameBuffer *pDVar4;
  undefined8 *puVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  EColorRange EVar9;
  level_info_t *plVar10;
  undefined4 extraout_var;
  undefined8 *puVar11;
  FTexture *pFVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar15;
  uint uVar16;
  code *__compar;
  uint uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  float fVar21;
  char *pcVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  float x;
  int iVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uStack_e4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  BYTE *pBStack_b8;
  BYTE *pBStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  BYTE *pBStack_98;
  uint uStack_90;
  uint uStack_8c;
  undefined8 uStack_88;
  int iStack_80;
  float fStack_7c;
  float afStack_78 [2];
  undefined8 uStack_70;
  float fStack_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  ulong uStack_58;
  ulong uStack_50;
  BYTE *pBStack_48;
  FTexture *pFStack_40;
  ulong uStack_38;
  
  if (state == LeavingIntermission) {
    return;
  }
  if (state == ShowNextLoc) {
    WI_drawBackground();
    if (lnodes.Count != 0 && splat != (FTexture *)0x0) {
      lVar20 = 8;
      uVar28 = 0;
      do {
        plVar10 = FindLevelInfo((lnodes.Array)->level + lVar20 + -8,true);
        if ((plVar10 != (level_info_t *)0x0) && ((int)plVar10->flags < 0)) {
          WI_drawOnLnode((int)uVar28,&splat,1);
        }
        uVar28 = uVar28 + 1;
        lVar20 = lVar20 + 0x14;
      } while (uVar28 < lnodes.Count);
    }
    uVar18 = yah.Count;
    uVar16 = lnodes.Count;
    if ((snl_pointeron == true) && (yah.Count != 0)) {
      uVar6 = WI_MapToIndex((wbs->next).Chars);
      if (uVar6 < uVar16) {
        WI_drawOnLnode(uVar6,yah.Array,uVar18);
      }
    }
    WI_drawEL();
    return;
  }
  if (state != StatCount) {
    snl_pointeron = true;
    WI_drawShowNextLoc();
    return;
  }
  if (deathmatch.Value != 0) {
    (*IntermissionFont->_vptr_FFont[3])(IntermissionFont,0x25);
    pFVar12 = FTextureManager::FindTexture(&TexMan,"READYICO",8,1);
    WI_drawBackground();
    iVar8 = WI_drawLF();
    HU_GetPlayerWidths((int *)&uStack_88,(int *)&uStack_8c,(int *)&uStack_90);
    dVar1 = (pFVar12->Scale).Y;
    uVar18 = (uint)((double)((uint)pFVar12->Height * 2) / dVar1);
    uVar16 = (uint)((double)(pFVar12->TopOffset * 2) / dVar1);
    uVar16 = ((uVar18 & 1) + ((int)uVar18 >> 1)) - ((uVar16 & 1) + ((int)uVar16 >> 1));
    if ((int)uVar16 <= (int)uStack_90) {
      uVar16 = uStack_90;
    }
    uVar6 = SmallFont->FontHeight * CleanYfac;
    uVar18 = uVar16 * CleanYfac;
    if ((int)(uVar16 * CleanYfac) < (int)uVar6) {
      uVar18 = uVar6;
    }
    uStack_a8 = (ulong)(uint)(iVar8 + CleanYfac);
    uStack_a0 = pFVar12;
    uStack_90 = uVar16;
    pBVar13 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_DEATHS");
    pBVar14 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_FRAGS");
    iVar8 = CleanXfac;
    iVar19 = (uStack_8c + 8) * CleanXfac;
    pBStack_b8 = pBVar14;
    iVar25 = FFont::StringWidth(SmallFont,"XXXXX");
    iVar27 = FFont::StringWidth(SmallFont,pBVar14);
    if (iVar27 < iVar25) {
      iVar27 = iVar25;
    }
    iVar23 = ((int)uStack_88 + iVar27 + 8) * CleanXfac + iVar19;
    iVar27 = FFont::StringWidth(SmallFont,pBVar13);
    pDVar4 = screen;
    pFVar3 = SmallFont;
    pBStack_b0 = (BYTE *)CONCAT44(extraout_var,iVar27);
    uVar17 = (iVar27 + 8) * CleanXfac + iVar23;
    pBStack_98 = (BYTE *)(ulong)uVar17;
    uVar16 = (int)((screen->super_DSimpleCanvas).super_DCanvas.Width - uVar17) >> 1;
    iVar19 = iVar19 + uVar16;
    iVar23 = iVar23 + uVar16;
    iVar25 = uVar16 + uVar17;
    iVar26 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + 3;
    pcVar22 = FStringTable::operator()(&GStrings,"SCORE_NAME");
    lVar20 = 0;
    iVar24 = (int)uStack_a8;
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iVar26,iVar19,iVar24,pcVar22,0x40001393,1,0);
    pBVar14 = pBStack_b8;
    pDVar4 = screen;
    pFVar3 = SmallFont;
    iVar27 = FFont::StringWidth(SmallFont,pBStack_b8);
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iVar26,iVar23 - iVar27 * CleanXfac,iVar24,
                      (char *)pBVar14,0x40001393,1,0);
    DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar26,iVar25 - (int)pBStack_b0 * CleanXfac,iVar24
                      ,(char *)pBVar13,0x40001393,1,0);
    uVar28 = 0;
    uVar30 = 1;
    do {
      *(ulong *)(afStack_78 + lVar20 * 2) =
           (long)&players + ((uVar28 >> 0x20) * 0x2a0 << 0x20) + (uVar28 & 0xffffffff) * 0x2a0;
      (&uStack_70)[lVar20] =
           (long)&players + ((uVar30 >> 0x20) * 0x2a0 << 0x20) + (uVar30 & 0xffffffff) * 0x2a0;
      lVar20 = lVar20 + 2;
      uVar28 = uVar28 + 2;
      uVar30 = uVar30 + 2;
    } while (lVar20 != 8);
    if (teamplay.Value == false) {
      __compar = comparepoints;
    }
    else {
      __compar = compareteams;
    }
    iVar26 = (int)((uVar18 - uVar6) + 1) / 2;
    iVar27 = iVar24 + uVar6 + CleanYfac * 6;
    qsort(afStack_78,8,8,__compar);
    lVar20 = 0;
    do {
      player = *(player_t **)(afStack_78 + lVar20 * 2);
      iVar24 = (int)((long)&player[-0x9192].secretcount >> 5) * 0x3cf3cf3d;
      if (playeringame[iVar24] == true) {
        D_GetPlayerColor(iVar24,&fStack_bc,&fStack_c0,&fStack_c4,(FPlayerColorSet **)0x0);
        HSVtoRGB(&fStack_c8,&fStack_cc,&fStack_d0,fStack_bc,fStack_c0,fStack_c4);
        iVar7 = (int)(fStack_c8 * 255.0);
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        iVar15 = (int)(fStack_cc * 255.0);
        if (0xfe < iVar15) {
          iVar15 = 0xff;
        }
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        uVar17 = (uint)(fStack_d0 * 255.0);
        if (0xfe < (int)uVar17) {
          uVar17 = 0xff;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                  (screen,(ulong)(uVar17 | iVar15 << 8 | iVar7 << 0x10),(ulong)uVar16,
                   (ulong)(uint)(iVar27 - iVar26),(ulong)(uint)((int)pBStack_98 + CleanXfac * 8),
                   (ulong)uVar18);
        if (playerready[iVar24] == false) {
          pDVar2 = (player->Bot).field_0.p;
          if (pDVar2 != (DBot *)0x0) {
            if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0049ba60;
            (player->Bot).field_0.p = (DBot *)0x0;
          }
        }
        else {
LAB_0049ba60:
          DCanvas::DrawTexture
                    ((DCanvas *)screen,uStack_a0,
                     (double)(int)(uVar16 - (uint)uStack_a0->Width * CleanXfac),(double)iVar27,
                     0x40001393,1,0);
        }
        EVar9 = HU_GetRowColor(player,consoleplayer == iVar24);
        uVar17 = (player->mo->ScoreIcon).texnum;
        if (0 < (long)(int)uVar17) {
          if (uVar17 < TexMan.Textures.Count) {
            pFVar12 = TexMan.Textures.Array[(int)uVar17].Texture;
          }
          else {
            pFVar12 = (FTexture *)0x0;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)screen,pFVar12,(double)(int)(uVar16 + iVar8 * 8),(double)iVar27,
                     0x40001393,1,0);
        }
        puVar5 = (undefined8 *)
                 ((long)&((player->userinfo).
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                         .Nodes)->Next +
                 (ulong)(((player->userinfo).
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                          .Size - 1 & 0x1ea) * 0x18));
        do {
          puVar11 = puVar5;
          puVar5 = (undefined8 *)*puVar11;
        } while (*(int *)(puVar11 + 1) != 0x1ea);
        iVar7 = iVar27 + iVar26;
        DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar9,iVar19,iVar7,
                          *(char **)(puVar11[2] + 0x28),0x40001393,1,0);
        WI_drawNum(SmallFont,iVar23,iVar7,cnt_frags[iVar24],0,false,EVar9);
        if (1 < ng_state) {
          WI_drawNum(SmallFont,iVar25,iVar7,cnt_deaths[iVar24],0,false,EVar9);
        }
        iVar27 = iVar27 + uVar18 + CleanYfac;
      }
      pDVar4 = screen;
      pFVar3 = SmallFont;
      lVar20 = lVar20 + 1;
      if (lVar20 == 8) {
        iVar8 = iVar27 + uVar6 + CleanYfac * 3;
        EVar9 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + CR_GREEN;
        pcVar22 = FStringTable::operator()(&GStrings,"SCORE_TOTAL");
        DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,EVar9,iVar19,iVar8,pcVar22,0x40001393,1,0);
        WI_drawNum(SmallFont,iVar23,iVar8,total_frags,0,false,EVar9);
        if (3 < ng_state) {
          WI_drawNum(SmallFont,iVar25,iVar8,total_deaths,0,false,EVar9);
        }
        iVar27 = iVar8 + uVar6 + CleanYfac;
        iVar8 = plrs[me].stime;
        pcVar22 = FStringTable::operator()(&GStrings,"SCORE_LVLTIME");
        FString::FString((FString *)&stack0xffffffffffffff18,pcVar22);
        FString::operator+=((FString *)&stack0xffffffffffffff18,": ");
        iVar8 = (int)(((long)iVar8 * 0x62) / 0xdac);
        uVar18 = ((uint)((short)(iVar8 % 0xe10) * -0x7777) >> 0x10) + iVar8 % 0xe10;
        mysnprintf((char *)((long)&uStack_88 + 7),9,"%02i:%02i:%02i",(ulong)(uint)(iVar8 / 0xe10),
                   (ulong)(uint)(int)(short)(((short)uVar18 >> 5) +
                                            (short)((uVar18 & 0xffff) >> 0xf)),
                   (ulong)(uint)(iVar8 % 0x3c));
        FString::operator+=((FString *)&stack0xffffffffffffff18,(char *)((long)&uStack_88 + 7));
        DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar9,uVar16,iVar27,
                          (char *)CONCAT44(uStack_e4,in_stack_ffffffffffffff18),0x40001393,1,0);
        FString::~FString((FString *)&stack0xffffffffffffff18);
        return;
      }
    } while( true );
  }
  if (!multiplayer) {
    WI_drawStats();
    return;
  }
  (*IntermissionFont->_vptr_FFont[3])(IntermissionFont,0x25);
  pFVar12 = FTextureManager::FindTexture(&TexMan,"READYICO",8,1);
  WI_drawBackground();
  iVar8 = WI_drawLF();
  HU_GetPlayerWidths(&iStack_5c,&iStack_60,&iStack_64);
  auVar29._0_8_ = (double)((uint)pFVar12->Height * 2);
  auVar29._8_8_ = (double)(pFVar12->TopOffset * 2);
  dVar1 = (pFVar12->Scale).Y;
  auVar31._8_8_ = dVar1;
  auVar31._0_8_ = dVar1;
  auVar29 = divpd(auVar29,auVar31);
  uVar28 = CONCAT44((int)auVar29._8_8_,(int)auVar29._0_8_) & 0x100000001;
  iVar27 = ((int)uVar28 + ((int)auVar29._0_8_ >> 1)) -
           ((int)(uVar28 >> 0x20) + ((int)auVar29._8_8_ >> 1));
  if (iStack_64 < iVar27) {
    iStack_64 = iVar27;
  }
  uStack_90 = SmallFont->FontHeight * CleanYfac;
  uStack_8c = iStack_64 * CleanYfac;
  if (iStack_64 * CleanYfac < (int)uStack_90) {
    uStack_8c = uStack_90;
  }
  uStack_50 = (ulong)(uint)((int)(((uStack_8c - uStack_90) -
                                  ((int)((uStack_8c - uStack_90) + 1) >> 0x1f)) + 1) >> 1);
  uStack_88 = (double)(ulong)(uint)(iVar8 + CleanYfac);
  pcVar22 = "SCORE_BONUS";
  if (((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) {
    pcVar22 = "SCORE_ITEMS";
  }
  pFStack_40 = pFVar12;
  pBVar13 = (BYTE *)FStringTable::operator()(&GStrings,pcVar22);
  pBStack_98 = pBVar13;
  pBStack_b0 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_SECRET");
  pBVar14 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_KILLS");
  pBStack_b8 = (BYTE *)(ulong)(uint)CleanXfac;
  iVar25 = (iStack_60 + 8) * CleanXfac;
  pBStack_48 = pBVar14;
  iVar27 = FFont::StringWidth(SmallFont,"XXXXX");
  iVar8 = FFont::StringWidth(SmallFont,pBVar14);
  if (iVar8 < iVar27) {
    iVar8 = iVar27;
  }
  iVar8 = (iStack_5c + iVar8 + 8) * CleanXfac + iVar25;
  uStack_a0._0_4_ = FFont::StringWidth(SmallFont,pBVar13);
  iVar19 = ((int)uStack_a0 + 8) * CleanXfac + iVar8;
  uStack_a0._4_4_ = extraout_var_00;
  uStack_a8._0_4_ = FFont::StringWidth(SmallFont,pBStack_b0);
  pDVar4 = screen;
  pFVar3 = SmallFont;
  uVar16 = ((int)uStack_a8 + 8) * CleanXfac + iVar19;
  uStack_38 = (ulong)uVar16;
  uVar18 = (int)((screen->super_DSimpleCanvas).super_DCanvas.Width - uVar16) >> 1;
  uStack_58 = (ulong)uVar18;
  pBStack_b8 = (BYTE *)CONCAT44(pBStack_b8._4_4_,uVar18 + (int)pBStack_b8 * 8);
  x = (float)(iVar25 + uVar18);
  fVar21 = (float)(iVar8 + uVar18);
  iVar19 = iVar19 + uVar18;
  fStack_c4 = (float)(uVar18 + uVar16);
  iVar8 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + 3;
  iStack_80 = iVar8;
  uStack_a8._4_4_ = extraout_var_01;
  pcVar22 = FStringTable::operator()(&GStrings,"SCORE_NAME");
  iVar25 = SUB84(uStack_88,0);
  fStack_bc = x;
  DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iVar8,(int)x,iVar25,pcVar22,0x40001393);
  pBVar13 = pBStack_48;
  pDVar4 = screen;
  pFVar3 = SmallFont;
  iVar27 = FFont::StringWidth(SmallFont,pBStack_48);
  iVar8 = iStack_80;
  fStack_c0 = fVar21;
  DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iStack_80,(int)fVar21 - iVar27 * CleanXfac,iVar25,
                    (char *)pBVar13,0x40001393);
  iVar27 = (int)uStack_a0 * CleanXfac;
  uStack_a0 = (FTexture *)CONCAT44(uStack_a0._4_4_,iVar19);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar8,iVar19 - iVar27,iVar25,(char *)pBStack_98,
                    0x40001393);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar8,(int)fStack_c4 - (int)uStack_a8 * CleanXfac,
                    iVar25,(char *)pBStack_b0,0x40001393);
  iVar27 = iVar25 + uStack_90 + CleanYfac * 6;
  pBStack_b0 = (BYTE *)CONCAT44(pBStack_b0._4_4_,wbs->maxkills);
  pBStack_98 = (BYTE *)CONCAT44(pBStack_98._4_4_,wbs->maxitems);
  uStack_a8 = CONCAT44(uStack_a8._4_4_,wbs->maxsecret);
  uStack_88 = (double)(int)pBStack_b8;
  uVar28 = 0;
  iVar8 = CleanYfac;
  do {
    if (playeringame[uVar28] == true) {
      D_GetPlayerColor((int)uVar28,&fStack_68,(float *)((long)&uStack_70 + 4),(float *)&uStack_70,
                       (FPlayerColorSet **)0x0);
      HSVtoRGB(afStack_78 + 1,afStack_78,&fStack_7c,fStack_68,uStack_70._4_4_,(float)uStack_70);
      iVar8 = (int)(afStack_78[1] * 255.0);
      if (0xfe < iVar8) {
        iVar8 = 0xff;
      }
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      iVar25 = (int)(afStack_78[0] * 255.0);
      if (0xfe < iVar25) {
        iVar25 = 0xff;
      }
      if (iVar25 < 1) {
        iVar25 = 0;
      }
      uVar16 = (uint)(fStack_7c * 255.0);
      if (0xfe < (int)uVar16) {
        uVar16 = 0xff;
      }
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (screen,(ulong)(uVar16 | iVar25 << 8 | iVar8 << 0x10),uStack_58,
                 (ulong)(uint)(iVar27 - (int)uStack_50),
                 (ulong)(uint)((int)uStack_38 + CleanXfac * 8),(ulong)uStack_8c);
      pBStack_b8 = (BYTE *)(double)iVar27;
      if (playerready[uVar28] == false) {
        if ((&DAT_017e1fd8)[uVar28 * 0x54] != 0) {
          if ((*(byte *)((&DAT_017e1fd8)[uVar28 * 0x54] + 0x20) & 0x20) == 0) goto LAB_0049c9aa;
          (&DAT_017e1fd8)[uVar28 * 0x54] = 0;
        }
      }
      else {
LAB_0049c9aa:
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFStack_40,
                   (double)(int)((int)uStack_58 - (uint)pFStack_40->Width * CleanXfac),
                   (double)pBStack_b8,0x40001393,1,0);
      }
      EVar9 = HU_GetRowColor((player_t *)(&players + uVar28 * 0x54),uVar28 == (uint)consoleplayer);
      uVar16 = (((player_t *)(&players + uVar28 * 0x54))->mo->ScoreIcon).texnum;
      if (0 < (long)(int)uVar16) {
        if (uVar16 < TexMan.Textures.Count) {
          pFVar12 = TexMan.Textures.Array[(int)uVar16].Texture;
        }
        else {
          pFVar12 = (FTexture *)0x0;
        }
        DCanvas::DrawTexture((DCanvas *)screen,pFVar12,uStack_88,(double)pBStack_b8,0x40001393,1,0);
      }
      puVar5 = (undefined8 *)
               ((ulong)(((&DAT_017e1e88)[uVar28 * 0xa8] - 1 & 0x1ea) * 0x18) +
               (&DAT_017e1e78)[uVar28 * 0x54]);
      do {
        puVar11 = puVar5;
        puVar5 = (undefined8 *)*puVar11;
      } while (*(int *)(puVar11 + 1) != 0x1ea);
      iVar8 = (int)uStack_50 + iVar27;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar9,(int)fStack_bc,iVar8,
                        *(char **)(puVar11[2] + 0x28),0x40001393);
      WI_drawPercent(SmallFont,(int)fStack_c0,iVar8,cnt_kills[uVar28],wbs->maxkills,false,EVar9);
      pBStack_b0 = (BYTE *)CONCAT44(pBStack_b0._4_4_,(int)pBStack_b0 - cnt_kills[uVar28]);
      if (3 < ng_state) {
        WI_drawPercent(SmallFont,(int)uStack_a0,iVar8,cnt_items[uVar28],wbs->maxitems,false,EVar9);
        pBStack_98 = (BYTE *)CONCAT44(pBStack_98._4_4_,(int)pBStack_98 - cnt_items[uVar28]);
        if (5 < ng_state) {
          WI_drawPercent(SmallFont,(int)fStack_c4,iVar8,cnt_secret[uVar28],wbs->maxsecret,false,
                         EVar9);
          uStack_a8 = CONCAT44(uStack_a8._4_4_,(int)uStack_a8 - cnt_secret[uVar28]);
        }
      }
      iVar27 = iVar27 + uStack_8c + CleanYfac;
      iVar8 = CleanYfac;
    }
    pDVar4 = screen;
    pFVar3 = SmallFont;
    uVar28 = uVar28 + 1;
    if (uVar28 == 8) {
      iVar27 = iVar8 * 3 + iVar27;
      pcVar22 = FStringTable::operator()(&GStrings,"SCORE_MISSED");
      DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,0x14,(int)fStack_bc,iVar27,pcVar22,0x40001393);
      WI_drawPercent(SmallFont,(int)fStack_c0,iVar27,(int)pBStack_b0,wbs->maxkills,false,CR_DARKGRAY
                    );
      if (3 < ng_state) {
        WI_drawPercent(SmallFont,(int)uStack_a0,iVar27,(int)pBStack_98,wbs->maxitems,false,
                       CR_DARKGRAY);
        if (5 < ng_state) {
          WI_drawPercent(SmallFont,(int)fStack_c4,iVar27,(int)uStack_a8,wbs->maxsecret,false,
                         CR_DARKGRAY);
        }
      }
      pDVar4 = screen;
      pFVar3 = SmallFont;
      iVar8 = iVar27 + uStack_90 + CleanYfac * 3;
      EVar9 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + CR_GREEN;
      pcVar22 = FStringTable::operator()(&GStrings,"SCORE_TOTAL");
      DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,EVar9,(int)fStack_bc,iVar8,pcVar22,0x40001393);
      WI_drawNum(SmallFont,(int)fStack_c0,iVar8,wbs->maxkills,0,false,EVar9);
      if (3 < ng_state) {
        WI_drawNum(SmallFont,(int)uStack_a0,iVar8,wbs->maxitems,0,false,EVar9);
        if (5 < ng_state) {
          WI_drawNum(SmallFont,(int)fStack_c4,iVar8,wbs->maxsecret,0,false,EVar9);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void WI_Drawer (void)
{
	switch (state)
	{
	case StatCount:
		if (deathmatch)
			WI_drawDeathmatchStats();
		else if (multiplayer)
			WI_drawNetgameStats();
		else
			WI_drawStats();
		break;
	
	case ShowNextLoc:
		WI_drawShowNextLoc();
		break;
	
	case LeavingIntermission:
		break;

	default:
		WI_drawNoState();
		break;
	}
}